

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzeqnarray.cpp
# Opt level: O1

void __thiscall
TPZEqnArray<std::complex<float>_>::EqnForward
          (TPZEqnArray<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *F,
          DecomposeType dec)

{
  float fVar1;
  uint uVar2;
  complex<float> *pcVar3;
  complex<float> *pcVar4;
  _ComplexT _Var5;
  ostream *poVar6;
  long *plVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  undefined8 uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined8 local_98;
  
  if (this->fSymmetric == EIsSymmetric) {
    if (0 < this->fNumEq) {
      uVar8 = 0;
      do {
        uVar2 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore[uVar8];
        lVar10 = (long)(int)uVar2;
        pcVar3 = (this->fEqValues).super_TPZManVector<std::complex<float>,_1000>.
                 super_TPZVec<std::complex<float>_>.fStore;
        fVar15 = *(float *)&pcVar3[lVar10]._M_value;
        if ((((fVar15 == 0.0) && (!NAN(fVar15))) &&
            (fVar15 = *(float *)((long)&pcVar3[lVar10]._M_value + 4), fVar15 == 0.0)) &&
           (!NAN(fVar15))) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Diagonal Value = 0 >> Aborting on Index = ",0x2a);
          poVar6 = (ostream *)std::ostream::operator<<(&std::cout,uVar2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," Equation = ",0xc);
          plVar7 = (long *)std::ostream::operator<<(poVar6,(int)uVar8);
          std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
          std::ostream::put((char)plVar7);
          std::ostream::flush();
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Frontal/tpzeqnarray.cpp"
                     ,0x8b);
        }
        if (uVar8 == this->fNumEq - 1) {
          iVar9 = (int)(this->fEqValues).super_TPZManVector<std::complex<float>,_1000>.
                       super_TPZVec<std::complex<float>_>.fNElements;
        }
        else {
          iVar9 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore[uVar8 + 1];
        }
        if ((dec & ~ELUPivot) == ELU) {
          pcVar3 = (this->fEqValues).super_TPZManVector<std::complex<float>,_1000>.
                   super_TPZVec<std::complex<float>_>.fStore;
          lVar11 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore
                         [lVar10];
          if (((lVar11 < 0) ||
              ((F->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <= lVar11)) ||
             ((F->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<std::complex<float>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pcVar4 = F->fElem;
          _Var5 = __divsc3((int)pcVar4[lVar11]._M_value,
                           *(undefined4 *)((long)&pcVar4[lVar11]._M_value + 4),
                           (int)pcVar3[lVar10]._M_value,
                           *(undefined4 *)((long)&pcVar3[lVar10]._M_value + 4));
          pcVar4[lVar11]._M_value = _Var5;
        }
        lVar11 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore[lVar10]
        ;
        if (((lVar11 < 0) ||
            ((F->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <= lVar11)) ||
           ((F->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<std::complex<float>_>::Error
                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar12 = lVar10 + 1;
        if ((int)lVar12 < iVar9) {
          _Var5 = F->fElem[lVar11]._M_value;
          fVar15 = (float)_Var5;
          fVar16 = (float)(_Var5 >> 0x20);
          iVar9 = ~uVar2 + iVar9;
          do {
            pcVar3 = (this->fEqValues).super_TPZManVector<std::complex<float>,_1000>.
                     super_TPZVec<std::complex<float>_>.fStore;
            fVar17 = *(float *)&pcVar3[lVar12]._M_value;
            fVar1 = *(float *)((long)&pcVar3[lVar12]._M_value + 4);
            fVar14 = fVar17 * fVar15 - fVar1 * fVar16;
            fVar17 = fVar17 * fVar16 + fVar1 * fVar15;
            uVar13 = CONCAT44(fVar17,fVar14);
            if ((NAN(fVar14)) && (uVar13 = CONCAT44(fVar17,fVar14), NAN(fVar17))) {
              uVar13 = __mulsc3(fVar15,CONCAT44(fVar16,fVar16));
            }
            lVar11 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore
                           [lVar12];
            if (((lVar11 < 0) ||
                ((F->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <= lVar11)) ||
               ((F->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<std::complex<float>_>::Error
                        ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            _Var5 = F->fElem[lVar11]._M_value;
            F->fElem[lVar11]._M_value =
                 CONCAT44((float)(_Var5 >> 0x20) - (float)((ulong)uVar13 >> 0x20),
                          (float)_Var5 - (float)uVar13);
            lVar12 = lVar12 + 1;
            iVar9 = iVar9 + -1;
          } while (iVar9 != 0);
        }
        if (dec == ELDLt) {
          pcVar3 = (this->fEqValues).super_TPZManVector<std::complex<float>,_1000>.
                   super_TPZVec<std::complex<float>_>.fStore;
          lVar11 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore
                         [lVar10];
          if (((lVar11 < 0) ||
              ((F->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <= lVar11)) ||
             ((F->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<std::complex<float>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pcVar4 = F->fElem;
          _Var5 = __divsc3((int)pcVar4[lVar11]._M_value,
                           *(undefined4 *)((long)&pcVar4[lVar11]._M_value + 4),
                           (int)pcVar3[lVar10]._M_value,
                           *(undefined4 *)((long)&pcVar3[lVar10]._M_value + 4));
          pcVar4[lVar11]._M_value = _Var5;
        }
        uVar8 = uVar8 + 1;
      } while ((long)uVar8 < (long)this->fNumEq);
    }
  }
  else if ((this->fSymmetric == EIsNonSymmetric) && (1 < this->fNumEq)) {
    uVar8 = 1;
    do {
      uVar2 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore[uVar8];
      lVar10 = (long)(int)uVar2;
      pcVar3 = (this->fEqValues).super_TPZManVector<std::complex<float>,_1000>.
               super_TPZVec<std::complex<float>_>.fStore;
      fVar15 = *(float *)&pcVar3[lVar10]._M_value;
      if ((((fVar15 == 0.0) && (!NAN(fVar15))) &&
          (fVar15 = *(float *)((long)&pcVar3[lVar10]._M_value + 4), fVar15 == 0.0)) &&
         (!NAN(fVar15))) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Diagonal Value = 0 >> Aborting on Index = ",0x2a);
        poVar6 = (ostream *)std::ostream::operator<<(&std::cout,uVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," Equation = ",0xc);
        plVar7 = (long *)std::ostream::operator<<(poVar6,(int)uVar8);
        std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
        std::ostream::put((char)plVar7);
        std::ostream::flush();
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Frontal/tpzeqnarray.cpp"
                   ,0xa5);
      }
      if (uVar8 == this->fNumEq - 1) {
        iVar9 = (int)(this->fEqValues).super_TPZManVector<std::complex<float>,_1000>.
                     super_TPZVec<std::complex<float>_>.fNElements;
      }
      else {
        iVar9 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore[uVar8 + 1];
      }
      if ((dec & ~ELUPivot) == ELU) {
        pcVar3 = (this->fEqValues).super_TPZManVector<std::complex<float>,_1000>.
                 super_TPZVec<std::complex<float>_>.fStore;
        lVar11 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore[lVar10]
        ;
        if (((lVar11 < 0) ||
            ((F->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <= lVar11)) ||
           ((F->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<std::complex<float>_>::Error
                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        pcVar4 = F->fElem;
        _Var5 = __divsc3((int)pcVar4[lVar11]._M_value,
                         *(undefined4 *)((long)&pcVar4[lVar11]._M_value + 4),
                         (int)pcVar3[lVar10]._M_value,
                         *(undefined4 *)((long)&pcVar3[lVar10]._M_value + 4));
        pcVar4[lVar11]._M_value = _Var5;
      }
      lVar11 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore[lVar10];
      if (((lVar11 < 0) ||
          ((F->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <= lVar11)) ||
         ((F->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<std::complex<float>_>::Error
                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar10 = lVar10 + 1;
      if ((int)lVar10 < iVar9) {
        _Var5 = F->fElem[lVar11]._M_value;
        fVar15 = (float)_Var5;
        fVar16 = (float)(_Var5 >> 0x20);
        local_98 = CONCAT44(fVar16,fVar16);
        iVar9 = ~uVar2 + iVar9;
        do {
          pcVar3 = (this->fEqValues).super_TPZManVector<std::complex<float>,_1000>.
                   super_TPZVec<std::complex<float>_>.fStore;
          fVar17 = *(float *)&pcVar3[lVar10]._M_value;
          fVar1 = *(float *)((long)&pcVar3[lVar10]._M_value + 4);
          fVar14 = fVar17 * fVar15 - fVar1 * fVar16;
          fVar17 = fVar17 * fVar16 + fVar1 * fVar15;
          uVar13 = CONCAT44(fVar17,fVar14);
          if ((NAN(fVar14)) && (uVar13 = CONCAT44(fVar17,fVar14), NAN(fVar17))) {
            uVar13 = __mulsc3(fVar15,local_98);
          }
          lVar11 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore
                         [lVar10];
          if (((lVar11 < 0) ||
              ((F->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <= lVar11)) ||
             ((F->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<std::complex<float>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          _Var5 = F->fElem[lVar11]._M_value;
          F->fElem[lVar11]._M_value =
               CONCAT44((float)(_Var5 >> 0x20) - (float)((ulong)uVar13 >> 0x20),
                        (float)_Var5 - (float)uVar13);
          lVar10 = lVar10 + 1;
          iVar9 = iVar9 + -1;
        } while (iVar9 != 0);
      }
      uVar8 = uVar8 + 2;
    } while ((int)uVar8 < this->fNumEq);
  }
  return;
}

Assistant:

void TPZEqnArray<TVar>::EqnForward(TPZFMatrix<TVar> & F, DecomposeType dec) {
	int j;
	if(IsSymmetric()==EIsSymmetric){
		
		for(j=0; j<fNumEq; j++) {
			int index = fEqStart[j];
			if(fEqValues[index] == (TVar)0.) {
				cout << "Diagonal Value = 0 >> Aborting on Index = " << index << " Equation = " << j << endl;
				DebugStop();
			}
			int last_term;
			if(j==fNumEq-1){
				last_term=fEqValues.NElements();
			}else last_term = fEqStart[j+1];
			
			/** cholesky e lu */
			if(dec==ECholesky || dec==ELU) {
				F(fIndex[index],0) /= fEqValues[index];
			}
			/** ldlt cholesky lu */
			TVar udiag = F(fIndex[index],0);
			
			int i;
			//+1 ou +2
			for(i = index + 1; i < last_term; i++) F(fIndex[i],0) -= udiag * fEqValues[i];
			/** finalizacao para ldlt */
			if(dec == ELDLt) F(fIndex[index],0) /= fEqValues[index];
		}
	} else if(IsSymmetric()==EIsNonSymmetric) {
		for(j=1; j<fNumEq; j+=2) {
			int index = fEqStart[j];
			
			if(fEqValues[index] == (TVar)0.){
				cout << "Diagonal Value = 0 >> Aborting on Index = " << index << " Equation = " << j << endl;
				DebugStop();
			}          
			
			int last_term;
			if(j==fNumEq-1){
				last_term=fEqValues.NElements();
			}else last_term = fEqStart[j+1];
			//if(fEqStart.NElements()
			
			
			/** cholesky e lu */
			if(dec==ECholesky || dec==ELU) {
				F(fIndex[index],0) /= fEqValues[index];
			}
			/** ldlt cholesky lu */
			TVar udiag = F(fIndex[index],0);
			
			
			int i;
			for(i = index + 1; i < last_term; i++) F(fIndex[i],0) -= udiag * fEqValues[i];
		}
	}
}